

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-client.c
# Opt level: O0

int lws_client_create_tls(lws *wsi,char **pcce,int do_c1)

{
  int iVar1;
  uint uVar2;
  lws_usec_t lVar3;
  int n;
  int do_c1_local;
  char **pcce_local;
  lws *wsi_local;
  
  if (((wsi->tls).use_ssl & 1) == 0) {
    (wsi->tls).ssl = (lws_tls_conn *)0x0;
  }
  else {
    if ((wsi->tls).ssl == (lws_tls_conn *)0x0) {
      if ((*(ulong *)&wsi->field_0x46e >> 0x35 & 1) == 0) {
        iVar1 = lws_tls_restrict_borrow((wsi->a).context);
        if (iVar1 != 0) {
          *pcce = "tls restriction limit";
          return -1;
        }
        *(ulong *)&wsi->field_0x46e =
             *(ulong *)&wsi->field_0x46e & 0xfffeffffffffffff | 0x1000000000000;
        if ((((wsi->a).context)->ssl_handshake_serialize != 0) &&
           (iVar1 = lws_ssl_handshake_serialize((wsi->a).context,wsi), iVar1 != 0)) {
          lws_tls_restrict_return((wsi->a).context);
          *(ulong *)&wsi->field_0x46e = *(ulong *)&wsi->field_0x46e & 0xfffeffffffffffff;
          *pcce = "ssl handshake serialization";
          return -1;
        }
      }
      iVar1 = lws_ssl_client_bio_create(wsi);
      if (iVar1 < 0) {
        *pcce = "bio_create failed";
        return -1;
      }
    }
    if (do_c1 == 0) {
      return 0;
    }
    lVar3 = lws_now_usecs();
    wsi->conmon_datum = lVar3;
    uVar2 = lws_ssl_client_connect1
                      (wsi,(char *)((wsi->a).context)->pt[(int)wsi->tsi].serv_buf,
                       (ulong)((wsi->a).context)->pt_serv_buf_size);
    _lws_log(0x10,"%s: lws_ssl_client_connect1: %d\n","lws_client_create_tls",(ulong)uVar2);
    if (uVar2 == 0) {
      return 1;
    }
    if ((int)uVar2 < 0) {
      *pcce = (char *)((wsi->a).context)->pt[(int)wsi->tsi].serv_buf;
      return -1;
    }
    lws_tls_server_conn_alpn(wsi);
  }
  return 0;
}

Assistant:

int
lws_client_create_tls(struct lws *wsi, const char **pcce, int do_c1)
{
	/* we can retry this... just cook the SSL BIO the first time */

	if (wsi->tls.use_ssl & LCCSCF_USE_SSL) {
		int n;

		if (!wsi->tls.ssl) {

#if defined(LWS_WITH_TLS)
			if (!wsi->transaction_from_pipeline_queue) {
				if (lws_tls_restrict_borrow(wsi->a.context)) {
					*pcce = "tls restriction limit";
					return CCTLS_RETURN_ERROR;
				}
				wsi->tls_borrowed = 1;
				if (wsi->a.context->ssl_handshake_serialize) {
					if (lws_ssl_handshake_serialize(wsi->a.context, wsi)) {
						lws_tls_restrict_return(wsi->a.context);
						wsi->tls_borrowed = 0;
						*pcce = "ssl handshake serialization";
						return CCTLS_RETURN_ERROR;
					}
				}
			}
#endif

			if (lws_ssl_client_bio_create(wsi) < 0) {
				*pcce = "bio_create failed";
				return CCTLS_RETURN_ERROR;
			}
		}

		if (!do_c1)
			return CCTLS_RETURN_DONE;

		lws_metrics_caliper_report(wsi->cal_conn, METRES_GO);
		lws_metrics_caliper_bind(wsi->cal_conn, wsi->a.context->mt_conn_tls);
#if defined(LWS_WITH_CONMON)
		wsi->conmon_datum = lws_now_usecs();
#endif

		n = lws_ssl_client_connect1(wsi, (char *)wsi->a.context->pt[(int)wsi->tsi].serv_buf,
					    wsi->a.context->pt_serv_buf_size);
		lwsl_debug("%s: lws_ssl_client_connect1: %d\n", __func__, n);
		if (!n)
			return CCTLS_RETURN_RETRY; /* caller should return 0 */

		if (n < 0) {
			*pcce = (const char *)wsi->a.context->pt[(int)wsi->tsi].serv_buf;
			lws_metrics_caliper_report(wsi->cal_conn, METRES_NOGO);
			return CCTLS_RETURN_ERROR;
		}
		/* ...connect1 already handled caliper if SSL_accept done */

		lws_tls_server_conn_alpn(wsi);

	} else
		wsi->tls.ssl = NULL;

	return CCTLS_RETURN_DONE; /* OK */
}